

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpiAnalyzerSettings.cpp
# Opt level: O2

bool __thiscall SpiAnalyzerSettings::SetSettingsFromInterfaces(SpiAnalyzerSettings *this)

{
  Channel *this_00;
  Channel *this_01;
  Channel *this_02;
  Channel *this_03;
  char cVar1;
  bool bVar2;
  double dVar3;
  Channel aCStack_a8 [16];
  vector<Channel,_std::allocator<Channel>_> channels;
  Channel miso;
  Channel mosi;
  Channel local_60 [16];
  Channel enable;
  Channel clock;
  
  AnalyzerSettingInterfaceChannel::GetChannel();
  AnalyzerSettingInterfaceChannel::GetChannel();
  AnalyzerSettingInterfaceChannel::GetChannel();
  AnalyzerSettingInterfaceChannel::GetChannel();
  channels.super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  channels.super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  channels.super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<Channel,_std::allocator<Channel>_>::push_back(&channels,&mosi);
  std::vector<Channel,_std::allocator<Channel>_>::push_back(&channels,&miso);
  std::vector<Channel,_std::allocator<Channel>_>::push_back(&channels,&clock);
  std::vector<Channel,_std::allocator<Channel>_>::push_back(&channels,&enable);
  cVar1 = AnalyzerHelpers::DoChannelsOverlap
                    (channels.super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (uint)((ulong)((long)channels.
                                          super__Vector_base<Channel,_std::allocator<Channel>_>.
                                          _M_impl.super__Vector_impl_data._M_finish -
                                   (long)channels.
                                         super__Vector_base<Channel,_std::allocator<Channel>_>.
                                         _M_impl.super__Vector_impl_data._M_start) >> 4));
  if (cVar1 == '\0') {
    Channel::Channel(aCStack_a8,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
    cVar1 = Channel::operator==(&mosi,aCStack_a8);
    if (cVar1 == '\0') {
      Channel::~Channel(aCStack_a8);
    }
    else {
      Channel::Channel(local_60,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
      cVar1 = Channel::operator==(&miso,local_60);
      Channel::~Channel(local_60);
      Channel::~Channel(aCStack_a8);
      if (cVar1 != '\0') goto LAB_00108c3a;
    }
    AnalyzerSettingInterfaceChannel::GetChannel();
    this_00 = &this->mMosiChannel;
    Channel::operator=(this_00,aCStack_a8);
    Channel::~Channel(aCStack_a8);
    AnalyzerSettingInterfaceChannel::GetChannel();
    this_01 = &this->mMisoChannel;
    Channel::operator=(this_01,aCStack_a8);
    Channel::~Channel(aCStack_a8);
    AnalyzerSettingInterfaceChannel::GetChannel();
    this_02 = &this->mClockChannel;
    Channel::operator=(this_02,aCStack_a8);
    Channel::~Channel(aCStack_a8);
    AnalyzerSettingInterfaceChannel::GetChannel();
    this_03 = &this->mEnableChannel;
    Channel::operator=(this_03,aCStack_a8);
    Channel::~Channel(aCStack_a8);
    dVar3 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
    this->mShiftOrder = (ShiftOrder)(long)dVar3;
    dVar3 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
    this->mBitsPerTransfer = (U32)(long)dVar3;
    dVar3 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
    this->mClockInactiveState = (BitState)(long)dVar3;
    dVar3 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
    this->mDataValidEdge = (Edge)(long)dVar3;
    dVar3 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
    this->mEnableActiveState = (BitState)(long)dVar3;
    AnalyzerSettings::ClearChannels();
    Channel::Channel(aCStack_a8,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
    Channel::operator!=(this_00,aCStack_a8);
    AnalyzerSettings::AddChannel((Channel *)this,(char *)this_00,true);
    Channel::~Channel(aCStack_a8);
    Channel::Channel(aCStack_a8,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
    Channel::operator!=(this_01,aCStack_a8);
    AnalyzerSettings::AddChannel((Channel *)this,(char *)this_01,true);
    Channel::~Channel(aCStack_a8);
    Channel::Channel(aCStack_a8,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
    Channel::operator!=(this_02,aCStack_a8);
    AnalyzerSettings::AddChannel((Channel *)this,(char *)this_02,true);
    Channel::~Channel(aCStack_a8);
    Channel::Channel(aCStack_a8,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
    Channel::operator!=(this_03,aCStack_a8);
    AnalyzerSettings::AddChannel((Channel *)this,(char *)this_03,true);
    Channel::~Channel(aCStack_a8);
    bVar2 = true;
  }
  else {
LAB_00108c3a:
    AnalyzerSettings::SetErrorText((char *)this);
    bVar2 = false;
  }
  std::vector<Channel,_std::allocator<Channel>_>::~vector(&channels);
  Channel::~Channel(&enable);
  Channel::~Channel(&clock);
  Channel::~Channel(&miso);
  Channel::~Channel(&mosi);
  return bVar2;
}

Assistant:

bool SpiAnalyzerSettings::SetSettingsFromInterfaces()
{
    Channel mosi = mMosiChannelInterface->GetChannel();
    Channel miso = mMisoChannelInterface->GetChannel();
    Channel clock = mClockChannelInterface->GetChannel();
    Channel enable = mEnableChannelInterface->GetChannel();

    std::vector<Channel> channels;
    channels.push_back( mosi );
    channels.push_back( miso );
    channels.push_back( clock );
    channels.push_back( enable );

    if( AnalyzerHelpers::DoChannelsOverlap( &channels[ 0 ], channels.size() ) == true )
    {
        SetErrorText( "Please select different channels for each input." );
        return false;
    }

    if( ( mosi == UNDEFINED_CHANNEL ) && ( miso == UNDEFINED_CHANNEL ) )
    {
        SetErrorText( "Please select at least one input for either MISO or MOSI." );
        return false;
    }

    mMosiChannel = mMosiChannelInterface->GetChannel();
    mMisoChannel = mMisoChannelInterface->GetChannel();
    mClockChannel = mClockChannelInterface->GetChannel();
    mEnableChannel = mEnableChannelInterface->GetChannel();

    mShiftOrder = ( AnalyzerEnums::ShiftOrder )U32( mShiftOrderInterface->GetNumber() );
    mBitsPerTransfer = U32( mBitsPerTransferInterface->GetNumber() );
    mClockInactiveState = ( BitState )U32( mClockInactiveStateInterface->GetNumber() );
    mDataValidEdge = ( AnalyzerEnums::Edge )U32( mDataValidEdgeInterface->GetNumber() );
    mEnableActiveState = ( BitState )U32( mEnableActiveStateInterface->GetNumber() );

    ClearChannels();
    AddChannel( mMosiChannel, "MOSI", mMosiChannel != UNDEFINED_CHANNEL );
    AddChannel( mMisoChannel, "MISO", mMisoChannel != UNDEFINED_CHANNEL );
    AddChannel( mClockChannel, "CLOCK", mClockChannel != UNDEFINED_CHANNEL );
    AddChannel( mEnableChannel, "ENABLE", mEnableChannel != UNDEFINED_CHANNEL );

    return true;
}